

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O2

int32 make_ci_list_cd_hash_frm_phnlist
                (char *phnlist,char ***CIlist,int32 *cilistsize,hashelement_t ***CDhash,
                int32 *NCDphones)

{
  phnhashelement_t *ppVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  FILE *pFVar6;
  phnhashelement_t **pppVar7;
  lineiter_t *li;
  size_t sVar8;
  hashelement_t *phVar9;
  heapelement_t *phVar10;
  char *pcVar11;
  char **ppcVar12;
  char *fmt;
  long ln;
  ulong uVar13;
  ulong uVar14;
  int32 heapsize;
  char *local_1090;
  uint local_1088;
  uint local_1084;
  uint local_1080;
  uint local_107c;
  phnhashelement_t **local_1078;
  FILE *local_1070;
  hashelement_t **local_1068;
  heapelement_t **heap;
  hashelement_t ***local_1058;
  int32 *local_1050;
  uint *local_1048;
  char ***local_1040;
  char lctx [1024];
  char wdpos [1024];
  char rctx [1024];
  char bphn [1024];
  
  heap = (heapelement_t **)0x0;
  local_1090 = phnlist;
  local_1058 = CDhash;
  local_1050 = NCDphones;
  local_1048 = (uint *)cilistsize;
  local_1040 = CIlist;
  pFVar6 = fopen(phnlist,"r");
  if (pFVar6 == (FILE *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x74,"Unable to open %s for reading\n",local_1090);
  }
  else {
    pppVar7 = (phnhashelement_t **)calloc(0x65,8);
    local_1068 = (hashelement_t **)
                 __ckd_calloc__(0x5dc1,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                ,0x78);
    local_1078 = pppVar7;
    phninstall("SIL",pppVar7);
    local_1070 = pFVar6;
    li = lineiter_start_clean((FILE *)pFVar6);
    local_1084 = 0;
    local_107c = 0;
    local_1080 = 0;
    uVar13 = 0;
    local_1088 = 0;
    while( true ) {
      if (li == (lineiter_t *)0x0) {
        local_1090 = (char *)uVar13;
        fclose(local_1070);
        heapsize = 0;
        uVar5 = 0;
        pFVar6 = (FILE *)0x0;
        while (pFVar6 != (FILE *)0x65) {
          pppVar7 = local_1078 + (long)pFVar6;
          local_1070 = pFVar6;
          while (ppVar1 = *pppVar7, ppVar1 != (phnhashelement_t *)0x0) {
            phVar10 = (heapelement_t *)
                      __ckd_calloc__(1,0x28,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                     ,0xad);
            pcVar11 = strdup(ppVar1->phone);
            phVar10->basephone = pcVar11;
            uVar5 = insert(&heap,uVar5,phVar10);
            heapsize = uVar5;
            pppVar7 = &ppVar1->next;
          }
          pFVar6 = (FILE *)((long)&local_1070->_flags + 1);
        }
        freephnhash(local_1078);
        *local_1048 = uVar5;
        ppcVar12 = (char **)__ckd_calloc_2d__((long)(int)uVar5,(ulong)((int)local_1090 + 1),1,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                              ,0xb5);
        *local_1040 = ppcVar12;
        uVar14 = 0;
        uVar13 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar13 = uVar14;
        }
        for (; uVar5 = local_1088, uVar13 != uVar14; uVar14 = uVar14 + 1) {
          phVar10 = yanktop(&heap,heapsize,&heapsize);
          strcpy(ppcVar12[uVar14],phVar10->basephone);
          free_heapelement(phVar10);
        }
        if (heapsize == 0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0xbd,"%d single word triphones in input phone list\n",(ulong)local_1088);
          uVar2 = local_1084;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0xbe,"%d word beginning triphones in input phone list\n",(ulong)local_1084);
          uVar3 = local_1080;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0xbf,"%d word internal triphones in input phone list\n",(ulong)local_1080);
          uVar4 = local_107c;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0xc0,"%d word ending triphones in input phone list\n",(ulong)local_107c);
          *local_1058 = local_1068;
          *local_1050 = uVar3 + uVar5 + uVar4 + uVar2;
          return 0;
        }
        __assert_fail("heapsize == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                      ,0xbb,
                      "int32 make_ci_list_cd_hash_frm_phnlist(const char *, char ***, int32 *, hashelement_t ***, int32 *)"
                     );
      }
      uVar5 = __isoc99_sscanf(li->buf,"%s %s %s %s",bphn,lctx,rctx,wdpos);
      if ((4 < uVar5) || ((0x1aU >> (uVar5 & 0x1f) & 1) == 0)) break;
      if (bphn._0_2_ == 0x2d) {
        pcVar11 = li->buf;
        fmt = "Bad entry triphone file %s\n%s\n";
        ln = 0x85;
        goto LAB_001035aa;
      }
      if (uVar5 == 1) {
LAB_001032bc:
        sVar8 = strlen(bphn);
        uVar14 = sVar8 & 0xffffffff;
        if ((int)sVar8 < (int)uVar13) {
          uVar14 = uVar13;
        }
        phninstall(bphn,local_1078);
        uVar13 = uVar14;
      }
      else {
        if (rctx._0_2_ == 0x2d && (short)lctx._0_4_ == 0x2d) goto LAB_001032bc;
        if (uVar5 == 3) {
          wdpos[0] = 'i';
          wdpos[1] = '\0';
        }
        if (((((char)lctx._0_4_ == '+') || (lctx._0_4_ == 0x4c4953)) ||
            ((rctx._0_2_ & 0xff) == 0x2b)) || (rctx._0_4_ == 0x4c4953)) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x93,"Fillers in triphone, skipping:\n%s\n",li->buf);
        }
        else {
          phVar9 = install(bphn,lctx,rctx,wdpos,local_1068);
          if (phVar9->dictcount == 0) {
            if (wdpos._0_2_ == 0x62) {
              local_1084 = local_1084 + 1;
            }
            else if (wdpos._0_2_ == 0x65) {
              local_107c = local_107c + 1;
            }
            else if (wdpos._0_2_ == 0x73) {
              local_1088 = local_1088 + 1;
            }
            else {
              local_1080 = local_1080 + (wdpos._0_2_ == 0x69);
            }
            phVar9->dictcount = 1;
          }
        }
      }
      li = lineiter_next(li);
    }
    pcVar11 = li->buf;
    fmt = "Incorrect format in triphone file %s\n%s\n";
    ln = 0x83;
LAB_001035aa:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,ln,fmt,local_1090,pcVar11);
  }
  exit(1);
}

Assistant:

int32 make_ci_list_cd_hash_frm_phnlist(const char  *phnlist,
		           	    char  ***CIlist, 
                           	    int32 *cilistsize,
			   	    hashelement_t ***CDhash,
				    int32 *NCDphones)
{
    char  bphn[1024],lctx[1024], rctx[1024], wdpos[1024]; 
    char  **cilist, *silence="SIL";
    lineiter_t *line = NULL;
    heapelement_t **heap=NULL, *addciphone;
    hashelement_t **tphnhash, *tphnptr;
    phnhashelement_t  **phnhash, *phnptr;

    int32 swdtphs, bwdtphs, ewdtphs, iwdtphs, maxphnsize, phnsize;
    int32 heapsize, i, nciphns, nwds;
    FILE  *fp;

    fp = fopen(phnlist,"r");
    if (fp==NULL) E_FATAL("Unable to open %s for reading\n",phnlist);

   /* Initially hash everything to remove duplications */
    phnhash = (phnhashelement_t**)calloc(PHNHASHSIZE,sizeof(phnhashelement_t*));
    tphnhash = (hashelement_t**) ckd_calloc(HASHSIZE, sizeof(hashelement_t*));
    maxphnsize = 0;
    swdtphs = bwdtphs = ewdtphs = iwdtphs = 0;
    /* Always install SIL in phonelist */
    phninstall(silence,phnhash);

    for (line = lineiter_start_clean(fp); line; line = lineiter_next(line)) {

        nwds = sscanf(line->buf,"%s %s %s %s",bphn,lctx,rctx,wdpos);

        if (nwds != 1 && nwds != 3 &&  nwds != 4)
	    E_FATAL("Incorrect format in triphone file %s\n%s\n",phnlist,line->buf);
        if (strcmp(bphn,"-") == 0)
	    E_FATAL("Bad entry triphone file %s\n%s\n",phnlist,line->buf);
	    
        if (nwds == 1 || (!strcmp(lctx,"-") && !strcmp(rctx,"-"))) {
	    phnsize = strlen(bphn);
 	    if (phnsize > maxphnsize) maxphnsize = phnsize;
	    phninstall(bphn,phnhash);
        }
        else {
            if (nwds == 3) strcpy(wdpos,"i"); /* default */
            if (!strcmp(lctx,"-") && !strcmp(rctx,"-") && !strcmp(wdpos,"-")){
	        E_WARN("Bad entry triphone file %s\n%s\n",phnlist,line->buf);
		continue;
	    }
	    if (IS_FILLER(lctx) || IS_FILLER(rctx)){
		E_WARN("Fillers in triphone, skipping:\n%s\n",line->buf);
		continue;
	    }
            if (!strcmp(wdpos,"i") && !strcmp(wdpos,"b") && 
		!strcmp(wdpos,"e") && !strcmp(wdpos,"s")){
		E_WARN("Bad word position type %s in triphone list\n",wdpos);
		E_WARN("Mapping it to word internal triphone\n");
		strcpy(wdpos,"i");
	    }
            tphnptr = install(bphn,lctx,rctx,wdpos,tphnhash);
	    if (tphnptr->dictcount == 0){
	        if (strcmp(wdpos,"s")==0) swdtphs++;
	        else if (strcmp(wdpos,"b")==0) bwdtphs++;
	        else if (strcmp(wdpos,"e")==0) ewdtphs++;
	        else if (strcmp(wdpos,"i")==0) iwdtphs++;
	        tphnptr->dictcount++;
	    }
	}
    }
    fclose(fp);

    /* Heap sort CI phones */
    heapsize = 0;
    for (i = 0; i < PHNHASHSIZE; i++) {
        phnptr = phnhash[i];
        while (phnptr != NULL) {
            addciphone = (heapelement_t *) ckd_calloc(1,sizeof(heapelement_t));
            addciphone->basephone = strdup(phnptr->phone);
            heapsize = insert(&heap, heapsize, addciphone);
            phnptr = phnptr->next;
        }
    }
    freephnhash(phnhash);
    *cilistsize = nciphns = heapsize;
    *CIlist = cilist = (char**)ckd_calloc_2d(nciphns,maxphnsize+1,sizeof(char));
    for (i = 0; i < nciphns; i++){
	addciphone = yanktop(&heap,heapsize,&heapsize);
        strcpy(cilist[i],addciphone->basephone);
        free_heapelement(addciphone);
    }
    assert(heapsize == 0);

    E_INFO("%d single word triphones in input phone list\n",swdtphs);
    E_INFO("%d word beginning triphones in input phone list\n",bwdtphs);
    E_INFO("%d word internal triphones in input phone list\n",iwdtphs);
    E_INFO("%d word ending triphones in input phone list\n",ewdtphs);

    *CDhash = tphnhash;
    *NCDphones = swdtphs + bwdtphs + iwdtphs + ewdtphs;

    return S3_SUCCESS;
}